

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsHexLower<unsigned_char>
          (IntDigits *this,uchar v)

{
  char *table;
  char *p;
  uchar v_local;
  IntDigits *this_local;
  
  table = this->storage_ + 0x2a;
  *(undefined2 *)table = *(undefined2 *)(numbers_internal::kHexTable + (ulong)v * 2);
  if (*table == '0') {
    table = this->storage_ + 0x2b;
  }
  this->start_ = table;
  this->size_ = (long)this + (0x3c - (long)table);
  return;
}

Assistant:

void PrintAsHexLower(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    do {
      p -= 2;
      constexpr const char* table = numbers_internal::kHexTable;
      std::memcpy(p, table + 2 * (static_cast<size_t>(v) & 0xFF), 2);
      if (sizeof(T) == 1) break;
      v >>= 8;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many digits.
      ++p;
    }
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }